

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int luaopen_jit(lua_State *L)

{
  lua_Integer in_RDI;
  size_t in_stack_00000008;
  char *in_stack_00000010;
  lua_State *in_stack_00000018;
  lua_CFunction *in_stack_00000078;
  uint8_t *in_stack_00000080;
  char *in_stack_00000088;
  lua_State *in_stack_00000090;
  
  lua_pushlstring(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  lua_pushlstring(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  lua_pushinteger(L,in_RDI);
  lua_pushlstring(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  lj_lib_register(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -0x10;
  jit_init(L);
  return 1;
}

Assistant:

LUALIB_API int luaopen_jit(lua_State *L)
{
  lua_pushliteral(L, LJ_OS_NAME);
  lua_pushliteral(L, LJ_ARCH_NAME);
  lua_pushinteger(L, LUAJIT_VERSION_NUM);
  lua_pushliteral(L, LUAJIT_VERSION);
  LJ_LIB_REG(L, LUA_JITLIBNAME, jit);
#ifndef LUAJIT_DISABLE_JITUTIL
  LJ_LIB_REG(L, "jit.util", jit_util);
#endif
#if LJ_HASJIT
  LJ_LIB_REG(L, "jit.opt", jit_opt);
#endif
  L->top -= 2;
  jit_init(L);
  return 1;
}